

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_highbd_hadamard_16x16_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*in_RDX) [32];
  __m256i b3;
  __m256i b2;
  __m256i b1;
  __m256i b0;
  __m256i coeff3;
  __m256i coeff2;
  __m256i coeff1;
  __m256i coeff0;
  int16_t *src_ptr;
  tran_low_t *t_coeff;
  int idx;
  undefined8 local_520;
  undefined8 uStackY_518;
  undefined8 uStackY_510;
  undefined8 uStackY_508;
  undefined8 local_500;
  undefined8 uStackY_4f8;
  undefined8 uStackY_4f0;
  undefined8 uStackY_4e8;
  undefined8 local_4e0;
  undefined8 uStackY_4d8;
  undefined8 uStackY_4d0;
  undefined8 uStackY_4c8;
  undefined8 local_4c0;
  undefined8 uStackY_4b8;
  undefined8 uStackY_4b0;
  undefined8 uStackY_4a8;
  undefined1 (*local_488) [32];
  int local_47c;
  undefined1 (*local_478) [32];
  tran_low_t *in_stack_fffffffffffffbe0;
  ptrdiff_t in_stack_fffffffffffffbe8;
  int16_t *in_stack_fffffffffffffbf0;
  
  for (local_47c = 0; local_47c < 4; local_47c = local_47c + 1) {
    aom_highbd_hadamard_8x8_avx2
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  }
  local_488 = in_RDX;
  local_478 = in_RDX;
  for (local_47c = 0; local_47c < 0x40; local_47c = local_47c + 8) {
    auVar1 = vpaddd_avx2(*local_488,local_488[8]);
    auVar5 = vpsubd_avx2(*local_488,local_488[8]);
    auVar2 = vpaddd_avx2(local_488[0x10],local_488[0x18]);
    auVar6 = vpsubd_avx2(local_488[0x10],local_488[0x18]);
    auVar3 = vpsrad_avx2(auVar1,ZEXT416(1));
    auVar5 = vpsrad_avx2(auVar5,ZEXT416(1));
    auVar4 = vpsrad_avx2(auVar2,ZEXT416(1));
    auVar6 = vpsrad_avx2(auVar6,ZEXT416(1));
    auVar1 = vpaddd_avx2(auVar3,auVar4);
    auVar2 = vpaddd_avx2(auVar5,auVar6);
    auVar3 = vpsubd_avx2(auVar3,auVar4);
    auVar5 = vpsubd_avx2(auVar5,auVar6);
    local_4c0 = auVar1._0_8_;
    uStackY_4b8 = auVar1._8_8_;
    uStackY_4b0 = auVar1._16_8_;
    uStackY_4a8 = auVar1._24_8_;
    *(undefined8 *)*local_478 = local_4c0;
    *(undefined8 *)(*local_478 + 8) = uStackY_4b8;
    *(undefined8 *)(*local_478 + 0x10) = uStackY_4b0;
    *(undefined8 *)(*local_478 + 0x18) = uStackY_4a8;
    local_4e0 = auVar2._0_8_;
    uStackY_4d8 = auVar2._8_8_;
    uStackY_4d0 = auVar2._16_8_;
    uStackY_4c8 = auVar2._24_8_;
    *(undefined8 *)local_478[8] = local_4e0;
    *(undefined8 *)(local_478[8] + 8) = uStackY_4d8;
    *(undefined8 *)(local_478[8] + 0x10) = uStackY_4d0;
    *(undefined8 *)(local_478[8] + 0x18) = uStackY_4c8;
    local_500 = auVar3._0_8_;
    uStackY_4f8 = auVar3._8_8_;
    uStackY_4f0 = auVar3._16_8_;
    uStackY_4e8 = auVar3._24_8_;
    *(undefined8 *)local_478[0x10] = local_500;
    *(undefined8 *)(local_478[0x10] + 8) = uStackY_4f8;
    *(undefined8 *)(local_478[0x10] + 0x10) = uStackY_4f0;
    *(undefined8 *)(local_478[0x10] + 0x18) = uStackY_4e8;
    local_520 = auVar5._0_8_;
    uStackY_518 = auVar5._8_8_;
    uStackY_510 = auVar5._16_8_;
    uStackY_508 = auVar5._24_8_;
    *(undefined8 *)local_478[0x18] = local_520;
    *(undefined8 *)(local_478[0x18] + 8) = uStackY_518;
    *(undefined8 *)(local_478[0x18] + 0x10) = uStackY_510;
    *(undefined8 *)(local_478[0x18] + 0x18) = uStackY_508;
    local_478 = local_478 + 1;
    local_488 = local_488 + 1;
  }
  return;
}

Assistant:

void aom_highbd_hadamard_16x16_avx2(const int16_t *src_diff,
                                    ptrdiff_t src_stride, tran_low_t *coeff) {
  int idx;
  tran_low_t *t_coeff = coeff;
  for (idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_highbd_hadamard_8x8_avx2(src_ptr, src_stride, t_coeff + idx * 64);
  }

  for (idx = 0; idx < 64; idx += 8) {
    __m256i coeff0 = _mm256_loadu_si256((const __m256i *)t_coeff);
    __m256i coeff1 = _mm256_loadu_si256((const __m256i *)(t_coeff + 64));
    __m256i coeff2 = _mm256_loadu_si256((const __m256i *)(t_coeff + 128));
    __m256i coeff3 = _mm256_loadu_si256((const __m256i *)(t_coeff + 192));

    __m256i b0 = _mm256_add_epi32(coeff0, coeff1);
    __m256i b1 = _mm256_sub_epi32(coeff0, coeff1);
    __m256i b2 = _mm256_add_epi32(coeff2, coeff3);
    __m256i b3 = _mm256_sub_epi32(coeff2, coeff3);

    b0 = _mm256_srai_epi32(b0, 1);
    b1 = _mm256_srai_epi32(b1, 1);
    b2 = _mm256_srai_epi32(b2, 1);
    b3 = _mm256_srai_epi32(b3, 1);

    coeff0 = _mm256_add_epi32(b0, b2);
    coeff1 = _mm256_add_epi32(b1, b3);
    coeff2 = _mm256_sub_epi32(b0, b2);
    coeff3 = _mm256_sub_epi32(b1, b3);

    _mm256_storeu_si256((__m256i *)coeff, coeff0);
    _mm256_storeu_si256((__m256i *)(coeff + 64), coeff1);
    _mm256_storeu_si256((__m256i *)(coeff + 128), coeff2);
    _mm256_storeu_si256((__m256i *)(coeff + 192), coeff3);

    coeff += 8;
    t_coeff += 8;
  }
}